

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer-source-line-finder.cc
# Opt level: O2

OffsetRange __thiscall
wabt::LexerSourceLineFinder::GetCachedLine(LexerSourceLineFinder *this,int line)

{
  pointer pRVar1;
  ulong uVar2;
  OffsetRange OVar3;
  
  uVar2 = (ulong)line;
  pRVar1 = (this->line_ranges_).
           super__Vector_base<wabt::Range<unsigned_long>,_std::allocator<wabt::Range<unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (uVar2 < (ulong)((long)(this->line_ranges_).
                            super__Vector_base<wabt::Range<unsigned_long>,_std::allocator<wabt::Range<unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1 >> 4)) {
    OVar3.end = pRVar1[uVar2].end;
    OVar3.start = pRVar1[uVar2].start;
    return OVar3;
  }
  __assert_fail("IsLineCached(line)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/lexer-source-line-finder.cc"
                ,0x4a,"OffsetRange wabt::LexerSourceLineFinder::GetCachedLine(int) const");
}

Assistant:

bool LexerSourceLineFinder::IsLineCached(int line) const {
  return static_cast<size_t>(line) < line_ranges_.size();
}